

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  CURLcode CVar4;
  curl_mimepart toppart;
  char buffer [8192];
  
  Curl_mime_initpart(&toppart,(Curl_easy *)0x0);
  CVar1 = Curl_getformdata((Curl_easy *)0x0,&toppart,form,(curl_read_callback)0x0);
  if (CVar1 == CURLE_OK) {
    CVar1 = Curl_mime_prepare_headers(&toppart,"multipart/form-data",(char *)0x0,MIMESTRATEGY_FORM);
  }
  while (CVar4 = CVar1, CVar4 == CURLE_OK) {
    sVar2 = Curl_mime_read(buffer,1,0x2000,&toppart);
    CVar1 = CURLE_OK;
    if (1 < sVar2 - 0x10000000) {
      if (sVar2 == 0) break;
      sVar3 = (*append)(arg,buffer,sVar2);
      CVar1 = CURLE_OK;
      if (sVar3 != sVar2) {
        CVar1 = CURLE_READ_ERROR;
      }
    }
  }
  Curl_mime_cleanpart(&toppart);
  return CVar4;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart, NULL); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(&toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    switch(nread) {
    default:
      if(append(arg, buffer, nread) != nread)
        result = CURLE_READ_ERROR;
      break;
    case CURL_READFUNC_ABORT:
    case CURL_READFUNC_PAUSE:
      break;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}